

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::DebugInfo::DebugInfo(DebugInfo *this)

{
  uint64_t uVar1;
  
  this->PrintStatistics = false;
  (this->OutputFile)._M_dataplus._M_p = (pointer)&(this->OutputFile).field_2;
  (this->OutputFile)._M_string_length = 0;
  (this->OutputFile).field_2._M_local_buf[0] = '\0';
  uVar1 = uv_hrtime();
  this->StartTime = uVar1;
  return;
}

Assistant:

DebugInfo()
    : StartTime(uv_hrtime())
  {
  }